

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O0

void duckdb::TupleDataAllocator::RecomputeHeapPointers
               (Vector *old_heap_ptrs,SelectionVector *old_heap_sel,data_ptr_t *row_locations,
               Vector *new_heap_ptrs,idx_t offset,idx_t count,TupleDataLayout *layout,
               idx_t base_col_offset)

{
  ulong uVar1;
  PhysicalType PVar2;
  LogicalTypeId type_id;
  bool bVar3;
  uint uVar4;
  uchar **count_00;
  idx_t iVar5;
  uchar *puVar6;
  TupleDataLayout *pTVar7;
  data_ptr_t *in_RCX;
  SelectionVector *in_RDX;
  Vector *in_RSI;
  TupleDataLayout *in_R8;
  TupleDataLayout *in_R9;
  TupleDataLayout *unaff_retaddr;
  TupleDataLayout *in_stack_00000008;
  idx_t in_stack_00000010;
  TupleDataLayout *struct_layout;
  long diff_1;
  uchar *list_ptr;
  data_ptr_t *list_ptr_location;
  uchar **new_heap_ptr_1;
  uchar **old_heap_ptr_1;
  ValidityBytes row_mask_1;
  data_ptr_t *row_location_1;
  idx_t idx_1;
  idx_t i_1;
  long diff;
  uchar *string_ptr;
  data_ptr_t string_ptr_location;
  data_ptr_t string_location;
  uchar **new_heap_ptr;
  uchar **old_heap_ptr;
  ValidityBytes row_mask;
  data_ptr_t *row_location;
  idx_t idx;
  idx_t i;
  value_type *type;
  idx_t idx_in_entry;
  idx_t entry_idx;
  value_type *col_offset;
  idx_t col_idx;
  SelectionVector new_heap_sel;
  uchar **new_heap_locations;
  UnifiedVectorFormat new_heap_data;
  uchar **old_heap_locations;
  TupleDataLayout *in_stack_fffffffffffffd18;
  TupleDataLayout *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  TupleDataLayout *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  idx_t in_stack_fffffffffffffde8;
  Vector *in_stack_fffffffffffffdf0;
  uchar *local_1d0;
  long local_1c8;
  uchar *local_1c0;
  const_data_ptr_t local_1b8;
  const_data_ptr_t *local_1b0;
  uchar **local_1a8;
  uchar **local_1a0;
  TemplatedValidityMask<unsigned_char> local_198;
  data_ptr_t local_178;
  data_ptr_t *local_170;
  idx_t local_168;
  TupleDataLayout *local_160;
  uchar *local_158;
  long local_150;
  uchar *local_148;
  data_ptr_t local_140;
  const_data_ptr_t local_138;
  uchar **local_130;
  uchar **local_128;
  undefined4 local_11c;
  TemplatedValidityMask<unsigned_char> local_118;
  data_ptr_t local_f8;
  data_ptr_t *local_f0;
  idx_t local_e8;
  TupleDataLayout *local_e0;
  const_reference local_d8;
  idx_t local_d0;
  idx_t local_c8;
  idx_t *local_c0;
  ulong local_b8;
  SelectionVector local_b0;
  uchar **local_98;
  UnifiedVectorFormat local_80;
  uchar **ppuVar8;
  uchar **ppuVar9;
  
  count_00 = FlatVector::GetData<unsigned_char*>((Vector *)0x1644464);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd30);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  local_98 = UnifiedVectorFormat::GetData<unsigned_char*>(&local_80);
  SelectionVector::SelectionVector
            ((SelectionVector *)in_stack_fffffffffffffd20,
             (SelectionVector *)in_stack_fffffffffffffd18);
  local_b8 = 0;
  do {
    uVar1 = local_b8;
    iVar5 = TupleDataLayout::ColumnCount((TupleDataLayout *)0x1644512);
    if (iVar5 <= uVar1) {
      SelectionVector::~SelectionVector((SelectionVector *)0x1644d31);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd20);
      return;
    }
    TupleDataLayout::GetOffsets(in_stack_00000008);
    local_c0 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)in_stack_fffffffffffffd20,
                          (size_type)in_stack_fffffffffffffd18);
    TemplatedValidityMask<unsigned_char>::GetEntryIndex(local_b8,&local_c8,&local_d0);
    TupleDataLayout::GetTypes(in_stack_00000008);
    local_d8 = vector<duckdb::LogicalType,_true>::operator[]
                         (&in_stack_fffffffffffffd20->types,(size_type)in_stack_fffffffffffffd18);
    PVar2 = LogicalType::InternalType(local_d8);
    if (PVar2 == VARCHAR) {
      for (local_e0 = (TupleDataLayout *)0x0; local_e0 < in_R9;
          local_e0 = (TupleDataLayout *)
                     ((long)&(local_e0->types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1)) {
        local_e8 = (long)&(in_R8->types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_e0;
        local_f8 = (data_ptr_t)((long)(&in_RDX->sel_vector)[local_e8] + in_stack_00000010);
        local_f0 = &local_f8;
        TupleDataLayout::ColumnCount((TupleDataLayout *)0x16446ff);
        TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
                  ((TemplatedValidityMask<unsigned_char> *)in_stack_fffffffffffffd30,
                   (uchar *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                   (idx_t)in_stack_fffffffffffffd20);
        puVar6 = TemplatedValidityMask<unsigned_char>::GetValidityEntryUnsafe(&local_118,local_c8);
        bVar3 = TemplatedValidityMask<unsigned_char>::RowIsValid(puVar6,&local_d0);
        ppuVar8 = count_00;
        if (bVar3) {
          iVar5 = SelectionVector::get_index((SelectionVector *)in_RSI,local_e8);
          ppuVar9 = local_98;
          local_128 = count_00 + iVar5;
          iVar5 = SelectionVector::get_index(&local_b0,local_e8);
          local_130 = ppuVar9 + iVar5;
          local_138 = *local_f0 + *local_c0;
          uVar4 = Load<unsigned_int>(local_138);
          if (0xc < uVar4) {
            local_140 = local_138 + 8;
            local_148 = Load<unsigned_char*>(local_140);
            local_150 = (long)local_148 - (long)*local_128;
            local_158 = *local_130 + local_150;
            Store<unsigned_char*>(&local_158,local_140);
          }
          local_11c = 0;
        }
        else {
          local_11c = 8;
        }
        TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
                  ((TemplatedValidityMask<unsigned_char> *)0x164492a);
        count_00 = ppuVar8;
      }
      in_stack_fffffffffffffd20 = in_R9;
      type_id = LogicalType::id(local_d8);
      in_R9 = in_stack_fffffffffffffd20;
      pTVar7 = in_R8;
      VerifyStrings(in_stack_00000008,type_id,(data_ptr_t *)in_RDX,local_b8,in_stack_00000010,
                    *local_c0,(idx_t)in_R8,(idx_t)in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd18 = in_R8;
      in_R8 = pTVar7;
    }
    else if (PVar2 == LIST) {
LAB_016449c9:
      for (local_160 = (TupleDataLayout *)0x0; local_160 < in_R9;
          local_160 = (TupleDataLayout *)
                      ((long)&(local_160->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1)) {
        local_168 = (long)&(in_R8->types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)local_160;
        local_178 = (data_ptr_t)((long)(&in_RDX->sel_vector)[local_168] + in_stack_00000010);
        local_170 = &local_178;
        TupleDataLayout::ColumnCount((TupleDataLayout *)0x1644a5a);
        TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
                  ((TemplatedValidityMask<unsigned_char> *)in_stack_fffffffffffffd30,
                   (uchar *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                   (idx_t)in_stack_fffffffffffffd20);
        puVar6 = TemplatedValidityMask<unsigned_char>::GetValidityEntryUnsafe(&local_198,local_c8);
        bVar3 = TemplatedValidityMask<unsigned_char>::RowIsValid(puVar6,&local_d0);
        if (bVar3) {
          ppuVar9 = count_00;
          iVar5 = SelectionVector::get_index((SelectionVector *)in_RSI,local_168);
          ppuVar8 = local_98;
          local_1a0 = count_00 + iVar5;
          iVar5 = SelectionVector::get_index(&local_b0,local_168);
          local_1a8 = ppuVar8 + iVar5;
          local_1b8 = *local_170 + *local_c0;
          local_1b0 = &local_1b8;
          local_1c0 = Load<unsigned_char*>(local_1b8);
          local_1c8 = (long)local_1c0 - (long)*local_1a0;
          local_1d0 = *local_1a8 + local_1c8;
          Store<unsigned_char*>(&local_1d0,*local_1b0);
          local_11c = 0;
          count_00 = ppuVar9;
        }
        else {
          local_11c = 0xb;
        }
        TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
                  ((TemplatedValidityMask<unsigned_char> *)0x1644c2f);
      }
    }
    else if (PVar2 == STRUCT) {
      pTVar7 = TupleDataLayout::GetStructLayout
                         (in_stack_fffffffffffffd20,(idx_t)in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd30 = pTVar7;
      in_stack_fffffffffffffd2f = TupleDataLayout::AllConstant(pTVar7);
      if (!(bool)in_stack_fffffffffffffd2f) {
        in_stack_fffffffffffffd20 = (TupleDataLayout *)(in_stack_00000010 + *local_c0);
        RecomputeHeapPointers
                  (in_RSI,in_RDX,in_RCX,(Vector *)in_R8,(idx_t)in_R9,(idx_t)count_00,unaff_retaddr,
                   (idx_t)in_stack_00000008);
        in_stack_fffffffffffffd18 = pTVar7;
      }
    }
    else if (PVar2 == ARRAY) goto LAB_016449c9;
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

void TupleDataAllocator::RecomputeHeapPointers(Vector &old_heap_ptrs, const SelectionVector &old_heap_sel,
                                               const data_ptr_t row_locations[], Vector &new_heap_ptrs,
                                               const idx_t offset, const idx_t count, const TupleDataLayout &layout,
                                               const idx_t base_col_offset) {
	const auto old_heap_locations = FlatVector::GetData<data_ptr_t>(old_heap_ptrs);

	UnifiedVectorFormat new_heap_data;
	new_heap_ptrs.ToUnifiedFormat(offset + count, new_heap_data);
	const auto new_heap_locations = UnifiedVectorFormat::GetData<data_ptr_t>(new_heap_data);
	const auto new_heap_sel = *new_heap_data.sel;

	for (idx_t col_idx = 0; col_idx < layout.ColumnCount(); col_idx++) {
		const auto &col_offset = layout.GetOffsets()[col_idx];

		// Precompute mask indexes
		idx_t entry_idx;
		idx_t idx_in_entry;
		ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

		const auto &type = layout.GetTypes()[col_idx];
		switch (type.InternalType()) {
		case PhysicalType::VARCHAR: {
			for (idx_t i = 0; i < count; i++) {
				const auto idx = offset + i;
				const auto &row_location = row_locations[idx] + base_col_offset;
				ValidityBytes row_mask(row_location, layout.ColumnCount());
				if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
					continue;
				}

				const auto &old_heap_ptr = old_heap_locations[old_heap_sel.get_index(idx)];
				const auto &new_heap_ptr = new_heap_locations[new_heap_sel.get_index(idx)];

				const auto string_location = row_location + col_offset;
				if (Load<uint32_t>(string_location) > string_t::INLINE_LENGTH) {
					const auto string_ptr_location = string_location + string_t::HEADER_SIZE;
					const auto string_ptr = Load<data_ptr_t>(string_ptr_location);
					const auto diff = string_ptr - old_heap_ptr;
					D_ASSERT(diff >= 0);
					Store<data_ptr_t>(new_heap_ptr + diff, string_ptr_location);
				}
			}
			VerifyStrings(layout, type.id(), row_locations, col_idx, base_col_offset, col_offset, offset, count);
			break;
		}
		case PhysicalType::LIST:
		case PhysicalType::ARRAY: {
			for (idx_t i = 0; i < count; i++) {
				const auto idx = offset + i;
				const auto &row_location = row_locations[idx] + base_col_offset;
				ValidityBytes row_mask(row_location, layout.ColumnCount());
				if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
					continue;
				}

				const auto &old_heap_ptr = old_heap_locations[old_heap_sel.get_index(idx)];
				const auto &new_heap_ptr = new_heap_locations[new_heap_sel.get_index(idx)];

				const auto &list_ptr_location = row_location + col_offset;
				const auto list_ptr = Load<data_ptr_t>(list_ptr_location);
				const auto diff = list_ptr - old_heap_ptr;
				D_ASSERT(diff >= 0);
				Store<data_ptr_t>(new_heap_ptr + diff, list_ptr_location);
			}
			break;
		}
		case PhysicalType::STRUCT: {
			const auto &struct_layout = layout.GetStructLayout(col_idx);
			if (!struct_layout.AllConstant()) {
				RecomputeHeapPointers(old_heap_ptrs, old_heap_sel, row_locations, new_heap_ptrs, offset, count,
				                      struct_layout, base_col_offset + col_offset);
			}
			break;
		}
		default:
			continue;
		}
	}
}